

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamping.c
# Opt level: O1

int timespec_diff(timespec *res,timespec *a,timespec *b)

{
  long lVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  iVar2 = -1;
  if (((b != (timespec *)0x0 && a != (timespec *)0x0) && (lVar1 = a->tv_sec, lVar1 != 0)) &&
     (uVar4 = b->tv_sec, uVar4 != 0)) {
    lVar3 = a->tv_nsec - b->tv_nsec;
    if (a->tv_nsec < b->tv_nsec) {
      res->tv_nsec = lVar3 + 1000000000;
      uVar4 = ~uVar4;
    }
    else {
      res->tv_nsec = lVar3;
      uVar4 = -uVar4;
    }
    res->tv_sec = lVar1 + uVar4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int timespec_diff(struct timespec *res, struct timespec *a, struct timespec *b)
{
	uint32_t billion = 1e9;

	if (!a || !b)
		return -1;
	if (a->tv_sec == 0 || b->tv_sec == 0)
		return -1;

	if (a->tv_nsec < b->tv_nsec) {
		res->tv_nsec = b->tv_nsec - a->tv_nsec;
		res->tv_nsec = billion - res->tv_nsec;
		res->tv_sec = a->tv_sec - 1 - b->tv_sec;

	} else {
		res->tv_nsec = a->tv_nsec - b->tv_nsec;
		res->tv_sec = a->tv_sec - b->tv_sec;
	}

	return 0;
}